

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O2

PackedFunc * __thiscall
tvm::runtime::Module::GetFunction
          (PackedFunc *__return_storage_ptr__,Module *this,string *name,bool query_imports)

{
  element_type *peVar1;
  pointer pMVar2;
  pointer pMVar3;
  function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> local_50;
  
  (*((this->node_).super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ->_vptr_ModuleNode[3])();
  if ((__return_storage_ptr__->body_).super__Function_base._M_manager == (_Manager_type)0x0 &&
      query_imports) {
    peVar1 = (this->node_).super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pMVar3 = (peVar1->imports_).
             super__Vector_base<tvm::runtime::Module,_std::allocator<tvm::runtime::Module>_>._M_impl
             .super__Vector_impl_data._M_start;
    pMVar2 = (peVar1->imports_).
             super__Vector_base<tvm::runtime::Module,_std::allocator<tvm::runtime::Module>_>._M_impl
             .super__Vector_impl_data._M_finish;
    do {
      if (pMVar3 == pMVar2) {
        return __return_storage_ptr__;
      }
      peVar1 = (pMVar3->node_).
               super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (**(code **)((long)peVar1->_vptr_ModuleNode + 0x18))(&local_50,peVar1,name,pMVar3);
      std::function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)>::operator=
                (&__return_storage_ptr__->body_,&local_50);
      std::_Function_base::~_Function_base(&local_50.super__Function_base);
      pMVar3 = pMVar3 + 1;
    } while ((__return_storage_ptr__->body_).super__Function_base._M_manager == (_Manager_type)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

inline PackedFunc Module::GetFunction(const std::string &name, bool query_imports) {
  PackedFunc pf = node_->GetFunction(name, node_);
  if (pf != nullptr)
    return pf;
  if (query_imports) {
    for (const Module &m : node_->imports_) {
      pf = m.node_->GetFunction(name, m.node_);
      if (pf != nullptr)
        return pf;
    }
  }
  return pf;
}